

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitTryTable(BinaryInstWriter *this,TryTable *curr)

{
  char *pcVar1;
  BufferWithRandomAccess *pBVar2;
  WasmBinaryWriter *this_00;
  U32LEB UVar3;
  uint uVar4;
  Name *pNVar5;
  bool *pbVar6;
  ulong index;
  Name name;
  
  BufferWithRandomAccess::operator<<(this->o,'\x1f');
  emitResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)53>).
                            super_Expression.type.id);
  BufferWithRandomAccess::operator<<
            (this->o,(U32LEB)(uint)(curr->catchTags).
                                   super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                                   usedElements);
  for (uVar4 = 0; index = (ulong)uVar4,
      index < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements; uVar4 = uVar4 + 1) {
    pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    pcVar1 = (pNVar5->super_IString).str._M_str;
    pBVar2 = this->o;
    pbVar6 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                       (&(curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,index);
    if (pcVar1 == (char *)0x0) {
      BufferWithRandomAccess::operator<<(pBVar2,*pbVar6 | 2);
    }
    else {
      BufferWithRandomAccess::operator<<(pBVar2,*pbVar6);
      this_00 = this->parent;
      pBVar2 = this->o;
      pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(curr->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
      UVar3.value = WasmBinaryWriter::getTagIndex(this_00,(Name)(pNVar5->super_IString).str);
      BufferWithRandomAccess::operator<<(pBVar2,UVar3);
    }
    pBVar2 = this->o;
    pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchDests).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    name.super_IString.str._M_str = (pNVar5->super_IString).str._M_str;
    name.super_IString.str._M_len = index;
    UVar3.value = getBreakIndex(this,name);
    BufferWithRandomAccess::operator<<(pBVar2,UVar3);
  }
  std::vector<wasm::Name,std::allocator<wasm::Name>>::emplace_back<wasm::Name&>
            ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->breakStack,
             (Name *)IMPOSSIBLE_CONTINUE);
  return;
}

Assistant:

void BinaryInstWriter::visitTryTable(TryTable* curr) {
  o << int8_t(BinaryConsts::TryTable);
  emitResultType(curr->type);
  o << U32LEB(curr->catchTags.size());
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    if (curr->catchTags[i]) {
      o << (curr->catchRefs[i] ? int8_t(BinaryConsts::CatchRef)
                               : int8_t(BinaryConsts::Catch));
      o << U32LEB(parent.getTagIndex(curr->catchTags[i]));
    } else {
      o << (curr->catchRefs[i] ? int8_t(BinaryConsts::CatchAllRef)
                               : int8_t(BinaryConsts::CatchAll));
    }
    o << U32LEB(getBreakIndex(curr->catchDests[i]));
  }
  // the binary format requires this; we have a block if we need one
  // catch_*** clauses should refer to block labels without entering the try
  // scope. So we do this at the end.
  breakStack.emplace_back(IMPOSSIBLE_CONTINUE);
}